

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm_image.hpp
# Opt level: O3

ssize_t __thiscall sisl::utility::ppm_image::write(ppm_image *this,int __fd,void *__buf,size_t __n)

{
  double *pdVar1;
  Index IVar2;
  Index IVar3;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar4;
  ostream *poVar5;
  long *plVar6;
  DenseStorage<double,__1,__1,_1,_0> *other;
  undefined8 *puVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  undefined4 in_register_00000034;
  uint d0;
  double dVar12;
  vector min_max;
  vector pix;
  ofstream fp;
  Matrix<double,__1,_1,_0,__1,_1> local_258;
  DenseStorage<double,__1,__1,_1,_0> local_248;
  int local_234;
  undefined1 local_230 [8];
  uint auStack_228 [2];
  pointer local_220;
  pointer local_218;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  uVar9 = (ulong)__buf & 0xffffffff;
  local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  pMVar4 = (Matrix<double,__1,_1,_0,__1,_1> *)malloc(0x10);
  if (((ulong)pMVar4 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pMVar4 == (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = operator_delete;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
       2;
  local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       0;
  local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pMVar4;
  if ((char)uVar9 == '\0') {
    auStack_228[0] = 0;
    auStack_228[1] = 0;
    local_220 = (pointer)0x1;
    local_218 = (pointer)0x1;
    (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)0x0;
    local_248.m_data = (double *)0x3ff0000000000000;
    local_230 = (undefined1  [8])&local_258;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_230,
               (Scalar *)&local_248);
    if (((long)&(local_218->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_data + (long)auStack_228 !=
         (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_230)->m_storage).m_rows
        ) || (local_220 != (pointer)0x1)) {
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
  }
  else {
    calc_minmax((ppm_image *)local_230);
    IVar2 = local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    pdVar1 = local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)local_230;
    local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_
         = auStack_228[0];
    local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
         = auStack_228[1];
    IVar3 = local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    local_230 = (undefined1  [8])pdVar1;
    local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_
         = (undefined4)IVar2;
    local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
         = SUB84(IVar2,4);
    auStack_228[0] =
         (undefined4)
         local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    auStack_228[1] =
         local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
         _4_4_;
    local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         IVar3;
    free(pdVar1);
  }
  std::ofstream::ofstream(local_230,*(char **)CONCAT44(in_register_00000034,__fd),_S_out|_S_bin);
  iVar11 = *(int *)((long)aiStack_210 +
                   (((Matrix<double,__1,_1,_0,__1,_1> *)((long)local_230 + -0x20))->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
  ;
  if (iVar11 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"P3",2);
    std::ios::widen((char)(ostream *)local_230 +
                    (char)(((Matrix<double,__1,_1,_0,__1,_1> *)((long)local_230 + -0x20))->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_rows);
    std::ostream::put((char)local_230);
    std::ostream::flush();
    poVar5 = (ostream *)std::ostream::operator<<(local_230,this->m_iWidth);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    plVar6 = (long *)std::ostream::operator<<(poVar5,this->m_iHeight);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"255",3);
    std::ios::widen((char)(ostream *)local_230 +
                    (char)(((Matrix<double,__1,_1,_0,__1,_1> *)((long)local_230 + -0x20))->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_rows);
    std::ostream::put((char)local_230);
    std::ostream::flush();
    iVar8 = this->m_iHeight;
    local_234 = iVar11;
    if (0 < iVar8) {
      iVar11 = this->m_iWidth;
      uVar9 = uVar9 ^ 1;
      uVar10 = 0;
      do {
        if (0 < iVar11) {
          d0 = 0;
          do {
            other = (DenseStorage<double,__1,__1,_1,_0> *)
                    array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::operator()(&this->m_aArray,d0,(ulong)uVar10);
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_248,other);
            if (local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows < 2) goto LAB_0013ac41;
            pdVar1 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                      local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data)->m_storage).m_data;
            dVar12 = (double)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              local_258.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data)->m_storage).m_rows - (double)pdVar1;
            if (1e-06 <= ABS(dVar12) || (char)uVar9 != '\0') {
              if (local_248.m_rows < 1) goto LAB_0013ac41;
              dVar12 = ((*local_248.m_data - (double)pdVar1) * 255.0) / dVar12;
              *local_248.m_data = dVar12;
              if ((local_248.m_rows == 1) ||
                 (pdVar1 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                            local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            .m_storage.m_data)->m_storage).m_data,
                 local_248.m_data[1] =
                      ((local_248.m_data[1] - (double)pdVar1) * 255.0) /
                      ((double)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                local_258.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data)->m_storage).m_rows - (double)pdVar1),
                 (ulong)local_248.m_rows < 3)) goto LAB_0013ac41;
              pdVar1 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data)->m_storage).m_data;
              local_248.m_data[2] =
                   ((local_248.m_data[2] - (double)pdVar1) * 255.0) /
                   ((double)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                             local_258.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data)->m_storage).m_rows - (double)pdVar1);
              iVar11 = (int)dVar12;
            }
            else {
              if (local_248.m_rows < 3) goto LAB_0013ac41;
              *local_248.m_data = 0.0;
              local_248.m_data[1] = 0.0;
              local_248.m_data[2] = 0.0;
              iVar11 = 0;
            }
            poVar5 = (ostream *)std::ostream::operator<<(local_230,iVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            if (local_248.m_rows < 2) {
LAB_0013ac41:
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)local_248.m_data[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            if (local_248.m_rows < 3) goto LAB_0013ac41;
            plVar6 = (long *)std::ostream::operator<<(poVar5,(int)local_248.m_data[2]);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            free(local_248.m_data);
            d0 = d0 + 1;
            iVar11 = this->m_iWidth;
          } while ((int)d0 < iVar11);
          iVar8 = this->m_iHeight;
        }
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < iVar8);
    }
    std::ofstream::close();
    iVar11 = local_234;
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)
   (local_230 +
   _VTT[-2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) =
       _memcpy;
  std::filebuf::~filebuf((filebuf *)auStack_228);
  std::ios_base::~ios_base(local_138);
  free(local_258.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return CONCAT71((int7)(uVar9 >> 8),iVar11 == 0);
}

Assistant:

bool write(const std::string &out, bool normalize = true) {
                using namespace std;
                vector min_max(2);

                if(!normalize) {
                    min_max << 0, 1.;
                }else {
                    min_max = calc_minmax();
    
                }

                // open file and check if it's valid
                ofstream fp(out.c_str(), ios::out | ios::binary);
                if(!fp.good()) return false;

                // write the header
                fp << "P3" << endl;
                fp << m_iWidth << " " << m_iHeight << endl;
                fp << "255" << endl;

                // Write image data
                for(int i = 0; i < m_iHeight; i++) {
                    for(int j = 0; j < m_iWidth; j++) {
                        vector pix = m_aArray(j,i);

                        // If min/max are equal, and we're normalizing, this is just blank
                        if(abs(min_max[1] - min_max[0]) < 1e-6 && normalize) {
                            pix[0] = pix[1] = pix[2] = 0.;
                        } else {
                            pix[0] = 255. * (pix[0] - min_max[0])/(min_max[1] - min_max[0]);
                            pix[1] = 255. * (pix[1] - min_max[0])/(min_max[1] - min_max[0]);
                            pix[2] = 255. * (pix[2] - min_max[0])/(min_max[1] - min_max[0]);
                        }
                        fp << (int)pix[0] << " " << (int)pix[1] << " " << (int)pix[2] << endl;
                    }
                }
                fp.close();
                return true;
            }